

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

void duckdb::TimeBucketOffsetFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  reference a;
  reference b;
  reference c;
  int64_t iVar2;
  ulong uVar3;
  int iVar4;
  idx_t count;
  code *fun;
  interval_t local_38;
  
  a = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  b = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  c = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  if (a->vector_type != CONSTANT_VECTOR) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t)>
              (a,b,c,result,args->count,
               TimeBucket::OffsetTernaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
              );
    return;
  }
  puVar1 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  uVar3 = *(ulong *)a->data;
  local_38.micros = *(ulong *)((long)a->data + 8);
  local_38._0_8_ = uVar3;
  if ((int)uVar3 == 0) {
    iVar2 = Interval::GetMicro(&local_38);
    if (0 < iVar2) {
      count = args->count;
      fun = TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
      ;
      goto LAB_00ec943d;
    }
    uVar3 = local_38._0_8_ & 0xffffffff;
    iVar4 = local_38.days;
  }
  else {
    iVar4 = (int)(uVar3 >> 0x20);
  }
  count = args->count;
  if ((((int)uVar3 < 1) || (iVar4 != 0)) || (local_38.micros != 0)) {
    fun = TimeBucket::OffsetTernaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>;
  }
  else {
    fun = TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>;
  }
LAB_00ec943d:
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t)>
            (a,b,c,result,count,fun);
  return;
}

Assistant:

static void TimeBucketOffsetFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &offset_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::Execute<interval_t, T, interval_t, T>(
		    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
		    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
	}
}